

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::OutputField(Node *this,ostream *os)

{
  ostream *poVar1;
  string sStack_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  for (; this->Type == 0x1f5; this = this->Tree[1]) {
    OutputField(this->Tree[0],os);
  }
  if (this->Type == 0x108) {
    Indent_abi_cxx11_(&local_98,this);
    poVar1 = std::operator<<(os,(string *)&local_98);
    Expression_abi_cxx11_(&sStack_b8,this->Tree[1]);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_b8);
    poVar1 = std::operator<<(poVar1,".ReMap(FieldBase, ");
    Expression_abi_cxx11_(&local_38,this->Tree[0]);
    poVar1 = std::operator<<(poVar1,(string *)&local_38);
    poVar1 = std::operator<<(poVar1,");");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    Indent_abi_cxx11_(&local_58,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_58);
    poVar1 = std::operator<<(poVar1,"FieldBase += ");
    Expression_abi_cxx11_(&local_78,this->Tree[0]);
    poVar1 = std::operator<<(poVar1,(string *)&local_78);
    poVar1 = std::operator<<(poVar1,";");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    poVar1 = std::operator<<(os,"// **** This shouldn\'t be possible ***** @ ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->lineno);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    Indent_abi_cxx11_(&local_98,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_98);
    genname(&sStack_b8,&this->TextValue);
    std::operator<<(poVar1,(string *)&sStack_b8);
  }
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void Node::OutputField(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	switch(Type)
	{
	case BAS_N_LIST:

		Tree[0]->OutputField(os);
		Tree[1]->OutputField(os);

		break;

	case BAS_S_AS:
		os << Indent() << Tree[1]->Expression() <<
			".ReMap(FieldBase, " << Tree[0]->Expression() <<
			");" << std::endl <<
			Indent() << "FieldBase += " << Tree[0]->Expression() << ";" << std::endl;
		break;

	default:
		os << "// **** This shouldn't be possible ***** @ " << lineno << std::endl <<
			Indent() << genname(TextValue);
		break;
	}
}